

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

void find_tag_name(StringRef *tag,char **name,size_t *len,int *is_end_tag)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  
  pcVar4 = tag->str + -1;
  do {
    cVar2 = pcVar4[1];
    pcVar4 = pcVar4 + 1;
    iVar3 = isspace((int)cVar2);
  } while (iVar3 != 0);
  *is_end_tag = (uint)(cVar2 == '/');
  if (cVar2 == '/') {
    do {
      pcVar1 = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
      iVar3 = isspace((int)*pcVar1);
    } while (iVar3 != 0);
  }
  *name = pcVar4;
  for (sVar5 = 0; pcVar4[sVar5] != '\0'; sVar5 = sVar5 + 1) {
    iVar3 = isspace((int)pcVar4[sVar5]);
    if (iVar3 != 0) break;
  }
  *len = sVar5;
  return;
}

Assistant:

static void find_tag_name(StringRef *tag, const char *&name, size_t &len,
                          int &is_end_tag)
{
    const char *p;

    /* skip leading spaces */
    for (p = tag->get() ; isspace(*p) ; ++p) ;

    /* if it's an end tag, skip the '/' and any intervening spaces */
    if ((is_end_tag = (*p == '/')) != 0)
        for (++p ; isspace(*p) ; ++p) ;

    /* scan the name - it's from here to the next space */
    for (name = p ; *p != '\0' && !isspace(*p) ; ++p) ;

    /* note the length */
    len = p - name;
}